

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_error(JSParseState *s,char *fmt,...)

{
  JSValue error_obj;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int64_t in_RSI;
  JSValueUnion *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  BOOL BStack000000000000005c;
  undefined8 in_stack_00000058;
  __va_list_tag *in_stack_00000060;
  char *in_stack_00000068;
  JSErrorEnum JStack0000000000000074;
  undefined8 in_stack_00000070;
  JSContext *in_stack_00000078;
  int backtrace_flags;
  va_list ap;
  JSContext *ctx;
  char acStack_108 [16];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  JSValue local_50;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *puVar1;
  char *filename;
  JSContext *in_stack_ffffffffffffffe0;
  JSValueUnion JVar2;
  
  JStack0000000000000074 = (JSErrorEnum)((ulong)in_stack_00000070 >> 0x20);
  BStack000000000000005c = (BOOL)((ulong)in_stack_00000058 >> 0x20);
  filename = acStack_108;
  if (in_AL != '\0') {
    local_d8 = in_XMM0_Qa;
    local_c8 = in_XMM1_Qa;
    local_b8 = in_XMM2_Qa;
    local_a8 = in_XMM3_Qa;
    local_98 = in_XMM4_Qa;
    local_88 = in_XMM5_Qa;
    local_78 = in_XMM6_Qa;
    local_68 = in_XMM7_Qa;
  }
  JVar2 = (JSValueUnion)in_RDI->ptr;
  puVar1 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x10;
  local_f8 = in_RDX;
  local_f0 = in_RCX;
  local_e8 = in_R8;
  local_e0 = in_R9;
  local_50 = JS_ThrowError2(in_stack_00000078,JStack0000000000000074,in_stack_00000068,
                            in_stack_00000060,BStack000000000000005c);
  local_3c = 0;
  if ((in_RDI[0xd].ptr != (void *)0x0) && (*(int *)((long)in_RDI[0xd].ptr + 0x80) != 0)) {
    local_3c = 2;
  }
  error_obj.tag = in_RSI;
  error_obj.u.ptr = JVar2.ptr;
  build_backtrace(in_stack_ffffffffffffffe0,error_obj,filename,(int)((ulong)puVar1 >> 0x20),
                  (int)puVar1);
  return -1;
}

Assistant:

int __attribute__((format(printf, 2, 3))) js_parse_error(JSParseState *s, const char *fmt, ...)
{
    JSContext *ctx = s->ctx;
    va_list ap;
    int backtrace_flags;
    
    va_start(ap, fmt);
    JS_ThrowError2(ctx, JS_SYNTAX_ERROR, fmt, ap, FALSE);
    va_end(ap);
    backtrace_flags = 0;
    if (s->cur_func && s->cur_func->backtrace_barrier)
        backtrace_flags = JS_BACKTRACE_FLAG_SINGLE_LEVEL;
    build_backtrace(ctx, ctx->rt->current_exception, s->filename, s->line_num,
                    backtrace_flags);
    return -1;
}